

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zesOverclockGetDomainVFProperties
          (zes_overclock_handle_t hDomainHandle,zes_vf_property_t *pVFProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010ead8 != (code *)0x0) {
    zVar1 = (*DAT_0010ead8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetDomainVFProperties(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_vf_property_t* pVFProperties                ///< [in,out] The VF min,max,step for a specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDomainVFProperties = context.zesDdiTable.Overclock.pfnGetDomainVFProperties;
        if( nullptr != pfnGetDomainVFProperties )
        {
            result = pfnGetDomainVFProperties( hDomainHandle, pVFProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }